

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NamedBlockClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedBlockClauseSyntax,slang::syntax::NamedBlockClauseSyntax_const&>
          (BumpAllocator *this,NamedBlockClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  NamedBlockClauseSyntax *pNVar13;
  
  pNVar13 = (NamedBlockClauseSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->colon).kind;
  uVar6 = (args->colon).field_0x2;
  NVar7.raw = (args->colon).numFlags.raw;
  uVar8 = (args->colon).rawLen;
  pIVar3 = (args->colon).info;
  TVar9 = (args->name).kind;
  uVar10 = (args->name).field_0x2;
  NVar11.raw = (args->name).numFlags.raw;
  uVar12 = (args->name).rawLen;
  (pNVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pNVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pNVar13->super_SyntaxNode).parent = pSVar1;
  (pNVar13->super_SyntaxNode).previewNode = pSVar2;
  (pNVar13->colon).kind = TVar5;
  (pNVar13->colon).field_0x2 = uVar6;
  (pNVar13->colon).numFlags = (NumericTokenFlags)NVar7.raw;
  (pNVar13->colon).rawLen = uVar8;
  (pNVar13->colon).info = pIVar3;
  (pNVar13->name).kind = TVar9;
  (pNVar13->name).field_0x2 = uVar10;
  (pNVar13->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pNVar13->name).rawLen = uVar12;
  (pNVar13->name).info = (args->name).info;
  return pNVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }